

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O3

fdb_status fdb_set_daemon_compaction_interval(fdb_file_handle *fhandle,size_t interval)

{
  fdb_kvs_handle *pfVar1;
  fdb_status fVar2;
  
  fVar2 = FDB_RESULT_INVALID_HANDLE;
  if (((fhandle != (fdb_file_handle *)0x0) &&
      (pfVar1 = fhandle->root, pfVar1 != (fdb_kvs_handle *)0x0)) &&
     (fVar2 = FDB_RESULT_INVALID_CONFIG, (pfVar1->config).compaction_mode == '\x01')) {
    fVar2 = compactor_set_compaction_interval(pfVar1->file,interval);
    return fVar2;
  }
  return fVar2;
}

Assistant:

LIBFDB_API
fdb_status fdb_set_daemon_compaction_interval(fdb_file_handle *fhandle,
                                              size_t interval)
{
    if (!fhandle || !fhandle->root) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    fdb_kvs_handle *handle = fhandle->root;

    if (handle->config.compaction_mode == FDB_COMPACTION_AUTO) {
        return compactor_set_compaction_interval(handle->file, interval);
    } else {
        return FDB_RESULT_INVALID_CONFIG;
    }
}